

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

QString * anon_unknown.dwarf_1185e52::errorMessageForSyscall(QUtf8StringView fnName,int errnoCode)

{
  long lVar1;
  undefined4 in_ECX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString msg;
  int in_stack_ffffffffffffff7c;
  QString *s;
  QString *in_stack_ffffffffffffff90;
  QBasicUtf8StringView<false> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s = in_RDI;
  qt_error_string((int)((ulong)in_RDI >> 0x20));
  QProcess::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffff7c);
  QString::arg<QBasicUtf8StringView<false>&,QString>
            ((QString *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90);
  QString::~QString((QString *)0x7a0ff2);
  QString::~QString((QString *)0x7a0ffc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

static QString errorMessageForSyscall(QUtf8StringView fnName, int errnoCode = -1)
{
    QString msg = qt_error_string(errnoCode);
    return QProcess::tr("Child process set up failed: %1: %2").arg(fnName, std::move(msg));
}